

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::RgbaInputFile::RgbaInputFile(RgbaInputFile *this,int partNumber,IStream *is,int numThreads)

{
  RgbaChannels RVar1;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  void *pvVar2;
  allocator<char> *in_RDI;
  undefined1 unaff_retaddr;
  int unaff_retaddr_00;
  IStream *in_stack_00000008;
  undefined4 in_stack_00000010;
  RgbaChannels in_stack_00000014;
  InputPart *in_stack_00000018;
  FromYca *in_stack_00000020;
  RgbaChannels rgbaChannels;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  MultiPartInputFile *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  allocator<char> local_2d [45];
  
  *(undefined ***)in_RDI = &PTR__RgbaInputFile_004dca30;
  __s = in_RDI + 8;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
             unaff_retaddr_00,(bool)unaff_retaddr);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)__s = this_00;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_RDI);
  std::allocator<char>::~allocator(local_2d);
  pvVar2 = operator_new(8);
  InputPart::InputPart
            ((InputPart *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  *(void **)(in_RDI + 0x10) = pvVar2;
  RVar1 = channels((RgbaInputFile *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if ((RVar1 & WRITE_C) != 0) {
    pvVar2 = operator_new(0x188);
    FromYca::FromYca(in_stack_00000020,in_stack_00000018,in_stack_00000014);
    *(void **)(in_RDI + 0x18) = pvVar2;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (
    int partNumber, OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : _multiPartFile (new MultiPartInputFile (is, numThreads))
    , _inputPart (nullptr)
    , _fromYca (nullptr)
    , _channelNamePrefix ("")
{
    try
    {
        _inputPart                = new InputPart (*_multiPartFile, partNumber);
        RgbaChannels rgbaChannels = channels ();
        if (rgbaChannels & WRITE_C)
            _fromYca = new FromYca (*_inputPart, rgbaChannels);
    }
    catch (...)
    {
        if (_inputPart) { delete _inputPart; }
        delete _multiPartFile;
        throw;
    }
}